

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf1_sync_alleles(bcf1_t *line,kstring_t *str)

{
  char *__s;
  size_t sVar1;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (*(ulong *)&line->field_0x10 >> 0x10 & 0xffff); uVar2 = uVar2 + 1) {
    __s = (line->d).allele[uVar2];
    sVar1 = strlen(__s);
    bcf_enc_vchar(str,(int)sVar1,__s);
  }
  if (((short)(*(ulong *)&line->field_0x10 >> 0x10) != 0) && (line->rlen == 0)) {
    sVar1 = strlen(*(line->d).allele);
    line->rlen = (int32_t)sVar1;
  }
  return;
}

Assistant:

static inline int _bcf1_sync_alleles(const bcf_hdr_t *hdr, bcf1_t *line, int nals)
{
    line->d.shared_dirty |= BCF1_DIRTY_ALS;

    line->n_allele = nals;
    hts_expand(char*, line->n_allele, line->d.m_allele, line->d.allele);

    char *als = line->d.als;
    int n = 0;
    while (n<nals)
    {
        line->d.allele[n] = als;
        while ( *als ) als++;
        als++;
        n++;
    }
    return 0;
}